

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.h
# Opt level: O1

Expression __thiscall dynet::RNNBuilder::add_input(RNNBuilder *this,RNNPointer *prev,Expression *x)

{
  iterator __position;
  long lVar1;
  undefined8 extraout_RDX;
  Expression EVar2;
  
  RNNStateMachine::transition((RNNStateMachine *)(prev + 4),add_input);
  __position._M_current = *(RNNPointer **)(prev + 8);
  if (__position._M_current == *(RNNPointer **)(prev + 10)) {
    std::vector<dynet::RNNPointer,std::allocator<dynet::RNNPointer>>::
    _M_realloc_insert<dynet::RNNPointer_const&>
              ((vector<dynet::RNNPointer,std::allocator<dynet::RNNPointer>> *)(prev + 6),__position,
               (RNNPointer *)x);
  }
  else {
    (__position._M_current)->t = *(int *)&x->pg;
    *(RNNPointer **)(prev + 8) = __position._M_current + 1;
  }
  lVar1 = *(long *)prev;
  prev[2].t = (int)((ulong)(*(long *)(prev + 8) - *(long *)(prev + 6)) >> 2) + -1;
  (**(code **)(lVar1 + 0x68))(this,prev,*(undefined4 *)&x->pg);
  EVar2._8_8_ = extraout_RDX;
  EVar2.pg = (ComputationGraph *)this;
  return EVar2;
}

Assistant:

Expression add_input(const RNNPointer& prev, const Expression& x) {
    sm.transition(RNNOp::add_input);
    head.push_back(prev);
    cur = head.size() - 1;
    return add_input_impl(prev, x);
  }